

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::CheckLaneIndex(WasmBytecodeGenerator *this,OpCodeAsmJs op,uint index)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  WasmCompilationException *this_00;
  undefined6 in_register_00000032;
  
  iVar2 = (int)CONCAT62(in_register_00000032,op);
  uVar4 = iVar2 - 0x147;
  if (uVar4 < 0x24) {
    if ((0x6003UL >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      if ((0xc00000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_00d7209a;
LAB_00d720f4:
      uVar4 = 0x10;
    }
    else {
      uVar4 = 2;
    }
  }
  else {
LAB_00d7209a:
    uVar4 = iVar2 - 0x1a9;
    if (uVar4 < 0x15) {
      if ((0x183U >> (uVar4 & 0x1f) & 1) != 0) {
        uVar4 = 4;
        goto LAB_00d720fa;
      }
      if ((0x180000U >> (uVar4 & 0x1f) & 1) == 0) goto LAB_00d720de;
    }
    else {
LAB_00d720de:
      if (1 < iVar2 - 0x20aU) {
        if (1 < iVar2 - 0x22cU) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x5e0,"((0))","UNREACHED");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
          goto LAB_00d72151;
        }
        goto LAB_00d720f4;
      }
    }
    uVar4 = 8;
  }
LAB_00d720fa:
  if (index < uVar4) {
    return;
  }
LAB_00d72151:
  this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException(this_00,L"index is out of range");
  __cxa_throw(this_00,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

void WasmBytecodeGenerator::CheckLaneIndex(Js::OpCodeAsmJs op, const uint index)
{
    uint numLanes;
    switch (op) 
    {
    case Js::OpCodeAsmJs::Simd128_ExtractLane_I2:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_I2:
    case Js::OpCodeAsmJs::Simd128_ExtractLane_D2:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_D2:
        numLanes = 2;
        break;
    case Js::OpCodeAsmJs::Simd128_ExtractLane_I4:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_I4:
    case Js::OpCodeAsmJs::Simd128_ExtractLane_F4:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_F4:
        numLanes = 4;
        break;
    case Js::OpCodeAsmJs::Simd128_ExtractLane_I8:
    case Js::OpCodeAsmJs::Simd128_ExtractLane_U8:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_I8:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_U8:
        numLanes = 8;
        break;
    case Js::OpCodeAsmJs::Simd128_ExtractLane_I16:
    case Js::OpCodeAsmJs::Simd128_ExtractLane_U16:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_I16:
    case Js::OpCodeAsmJs::Simd128_ReplaceLane_U16:
        numLanes = 16;
        break;
    default:
        Assert(UNREACHED);
        numLanes = 0;
    }

    if (index >= numLanes)
    {
        throw WasmCompilationException(_u("index is out of range"));
    }
}